

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::hilbert_split
          (tetgenmesh *this,point *vertexarray,int arraysize,int gc0,int gc1,double bxmin,
          double bxmax,double bymin,double bymax,double bzmin,double bzmax)

{
  point pdVar1;
  int iVar2;
  int iVar3;
  int local_78;
  int local_74;
  int j;
  int i;
  double split;
  int d;
  int axis;
  point swapvert;
  double bzmax_local;
  double bzmin_local;
  double bymax_local;
  double bymin_local;
  double bxmax_local;
  double bxmin_local;
  int gc1_local;
  int gc0_local;
  int arraysize_local;
  point *vertexarray_local;
  tetgenmesh *this_local;
  
  iVar2 = (gc0 ^ gc1) >> 1;
  if (iVar2 == 0) {
    _j = bxmin + bxmax;
  }
  else if (iVar2 == 1) {
    _j = bymin + bymax;
  }
  else {
    _j = bzmin + bzmax;
  }
  _j = _j * 0.5;
  iVar3 = -1;
  if ((gc0 & 1 << ((byte)iVar2 & 0x1f)) == 0) {
    iVar3 = 1;
  }
  local_74 = 0;
  local_78 = arraysize + -1;
  if (iVar3 < 1) {
    while( true ) {
      while ((local_74 < arraysize && (_j < vertexarray[local_74][iVar2]))) {
        local_74 = local_74 + 1;
      }
      while ((-1 < local_78 && (vertexarray[local_78][iVar2] <= _j))) {
        local_78 = local_78 + -1;
      }
      if (local_74 == local_78 + 1) break;
      pdVar1 = vertexarray[local_74];
      vertexarray[local_74] = vertexarray[local_78];
      vertexarray[local_78] = pdVar1;
    }
  }
  else {
    while( true ) {
      while ((local_74 < arraysize && (vertexarray[local_74][iVar2] < _j))) {
        local_74 = local_74 + 1;
      }
      while ((-1 < local_78 && (_j <= vertexarray[local_78][iVar2]))) {
        local_78 = local_78 + -1;
      }
      if (local_74 == local_78 + 1) break;
      pdVar1 = vertexarray[local_74];
      vertexarray[local_74] = vertexarray[local_78];
      vertexarray[local_78] = pdVar1;
    }
  }
  return local_74;
}

Assistant:

int tetgenmesh::hilbert_split(point* vertexarray,int arraysize,int gc0,int gc1,
                              REAL bxmin, REAL bxmax, REAL bymin, REAL bymax, 
                              REAL bzmin, REAL bzmax)
{
  point swapvert;
  int axis, d;
  REAL split;
  int i, j;


  // Find the current splitting axis. 'axis' is a value 0, or 1, or 2, which 
  //   correspoding to x-, or y- or z-axis.
  axis = (gc0 ^ gc1) >> 1; 

  // Calulate the split position along the axis.
  if (axis == 0) {
    split = 0.5 * (bxmin + bxmax);
  } else if (axis == 1) {
    split = 0.5 * (bymin + bymax);
  } else { // == 2
    split = 0.5 * (bzmin + bzmax);
  }

  // Find the direction (+1 or -1) of the axis. If 'd' is +1, the direction
  //   of the axis is to the positive of the axis, otherwise, it is -1.
  d = ((gc0 & (1<<axis)) == 0) ? 1 : -1;


  // Partition the vertices into left- and right-arrays such that left points
  //   have Hilbert indices lower than the right points.
  i = 0;
  j = arraysize - 1;

  // Partition the vertices into left- and right-arrays.
  if (d > 0) {
    do {
      for (; i < arraysize; i++) {      
        if (vertexarray[i][axis] >= split) break;
      }
      for (; j >= 0; j--) {
        if (vertexarray[j][axis] < split) break;
      }
      // Is the partition finished?
      if (i == (j + 1)) break;
      // Swap i-th and j-th vertices.
      swapvert = vertexarray[i];
      vertexarray[i] = vertexarray[j];
      vertexarray[j] = swapvert;
      // Continue patitioning the array;
    } while (true);
  } else {
    do {
      for (; i < arraysize; i++) {      
        if (vertexarray[i][axis] <= split) break;
      }
      for (; j >= 0; j--) {
        if (vertexarray[j][axis] > split) break;
      }
      // Is the partition finished?
      if (i == (j + 1)) break;
      // Swap i-th and j-th vertices.
      swapvert = vertexarray[i];
      vertexarray[i] = vertexarray[j];
      vertexarray[j] = swapvert;
      // Continue patitioning the array;
    } while (true);
  }

  return i;
}